

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Functional::VertexIDCase::init(VertexIDCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  RenderTarget *pRVar4;
  NotSupportedError *pNVar5;
  ShaderProgram *pSVar6;
  TestLog *log;
  TestError *this_00;
  reference pvVar7;
  Vector<float,_4> local_3e8;
  Vector<float,_4> local_3d8;
  Vector<float,_4> local_3c8;
  Vector<float,_4> local_3b8;
  Vector<float,_4> local_3a8;
  Vector<float,_4> local_398;
  float local_388;
  float local_384;
  float y0;
  float x0;
  int quadX;
  int quadY;
  int quadNdx;
  int triNdx;
  float w;
  float h;
  int vtxNdx;
  float local_35c [2];
  Vector<float,_4> local_354;
  Vector<float,_4> local_344;
  Vector<float,_4> local_334;
  Vector<float,_4> local_324;
  Vector<float,_4> local_314;
  Vector<float,_4> local_304;
  Vector<float,_4> local_2f4;
  Vector<float,_4> local_2e4;
  Vector<float,_4> local_2d4;
  Vector<float,_4> local_2c4;
  Vector<float,_4> local_2b4;
  Vector<float,_4> local_2a4;
  Vector<float,_4> local_294;
  Vector<float,_4> local_284;
  Vector<float,_4> local_274;
  Vector<float,_4> local_264;
  Vector<float,_4> local_254;
  Vector<float,_4> local_244;
  Vector<float,_4> local_234;
  Vector<float,_4> local_224;
  Vector<float,_4> local_214;
  Vector<float,_4> local_204;
  Vector<float,_4> local_1f4;
  undefined1 local_1e2;
  allocator<char> local_1e1;
  string local_1e0;
  undefined1 local_1ba;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  ProgramSources local_170;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98;
  int local_74;
  int local_70;
  int viewportH;
  int viewportW;
  int numQuads;
  int numVertices;
  int maxQuadsX;
  allocator<char> local_49;
  string local_48;
  undefined4 local_28;
  undefined4 local_24;
  int quadHeight;
  int quadWidth;
  int height;
  int width;
  Functions *gl;
  VertexIDCase *this_local;
  
  gl = (Functions *)this;
  pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  _height = CONCAT44(extraout_var,iVar2);
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  quadWidth = tcu::RenderTarget::getWidth(pRVar4);
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  quadHeight = tcu::RenderTarget::getHeight(pRVar4);
  local_24 = 0x20;
  local_28 = 0x20;
  if (quadWidth < 0x20) {
    numVertices._3_1_ = 1;
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Too small render target",&local_49);
    tcu::NotSupportedError::NotSupportedError(pNVar5,&local_48);
    numVertices._3_1_ = 0;
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  numQuads = quadWidth / 0x20;
  viewportW = 0x18;
  viewportH = 4;
  local_70 = de::min<int>(4,numQuads);
  local_70 = local_70 << 5;
  local_74 = ((int)(4 / (long)numQuads) + (uint)((int)(4 % (long)numQuads) != 0)) * 0x20;
  if (quadHeight < local_74) {
    local_9a = 1;
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Too small render target",&local_99);
    tcu::NotSupportedError::NotSupportedError(pNVar5,&local_98);
    local_9a = 0;
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pSVar6 = (ShaderProgram *)operator_new(0xd0);
  local_1ba = 1;
  pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,
             "#version 300 es\nin highp vec4 a_position;\nout mediump vec4 v_color;\nuniform highp vec4 u_colors[24];\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = u_colors[gl_VertexID];\n}\n"
             ,&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,
             "#version 300 es\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = v_color;\n}\n"
             ,&local_1b9);
  glu::makeVtxFragSources(&local_170,&local_190,&local_1b8);
  glu::ShaderProgram::ShaderProgram(pSVar6,pRVar3,&local_170);
  local_1ba = 0;
  this->m_program = pSVar6;
  glu::ProgramSources::~ProgramSources(&local_170);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(log,this->m_program);
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar1) {
    pSVar6 = this->m_program;
    if (pSVar6 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar6);
      operator_delete(pSVar6,0xd0);
    }
    this->m_program = (ShaderProgram *)0x0;
    local_1e2 = 1;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"Compile failed",&local_1e1);
    tcu::TestError::TestError(this_00,&local_1e0);
    local_1e2 = 0;
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_height + 0x6c8))(1,&this->m_positionBuffer);
  (**(code **)(_height + 0x6c8))(1,&this->m_elementBuffer);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_colors,0x18);
  tcu::Vector<float,_4>::Vector(&local_1f4,0.0,0.0,0.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0);
  *(undefined8 *)pvVar7->m_data = local_1f4.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_1f4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_204,0.5,1.0,0.5,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,1);
  *(undefined8 *)pvVar7->m_data = local_204.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_204.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_214,0.0,0.5,1.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,2);
  *(undefined8 *)pvVar7->m_data = local_214.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_214.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_224,0.0,1.0,0.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,3);
  *(undefined8 *)pvVar7->m_data = local_224.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_224.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_234,0.0,1.0,1.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,4);
  *(undefined8 *)pvVar7->m_data = local_234.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_234.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_244,0.5,0.0,0.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,5);
  *(undefined8 *)pvVar7->m_data = local_244.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_244.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_254,0.5,0.0,1.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,6);
  *(undefined8 *)pvVar7->m_data = local_254.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_254.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_264,0.5,0.0,0.5,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,7);
  *(undefined8 *)pvVar7->m_data = local_264.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_264.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_274,1.0,0.0,0.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,8);
  *(undefined8 *)pvVar7->m_data = local_274.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_274.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_284,0.5,1.0,0.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,9);
  *(undefined8 *)pvVar7->m_data = local_284.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_284.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_294,0.0,0.5,0.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,10);
  *(undefined8 *)pvVar7->m_data = local_294.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_294.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_2a4,0.5,1.0,1.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0xb);
  *(undefined8 *)pvVar7->m_data = local_2a4.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_2a4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_2b4,0.0,0.0,1.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0xc);
  *(undefined8 *)pvVar7->m_data = local_2b4.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_2b4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_2c4,1.0,0.0,0.5,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0xd);
  *(undefined8 *)pvVar7->m_data = local_2c4.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_2c4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_2d4,0.0,0.5,0.5,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0xe);
  *(undefined8 *)pvVar7->m_data = local_2d4.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_2d4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_2e4,1.0,1.0,0.5,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0xf);
  *(undefined8 *)pvVar7->m_data = local_2e4.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_2e4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_2f4,1.0,0.0,1.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0x10);
  *(undefined8 *)pvVar7->m_data = local_2f4.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_2f4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_304,1.0,0.5,0.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0x11);
  *(undefined8 *)pvVar7->m_data = local_304.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_304.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_314,0.0,1.0,0.5,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0x12);
  *(undefined8 *)pvVar7->m_data = local_314.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_314.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_324,1.0,0.5,1.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0x13);
  *(undefined8 *)pvVar7->m_data = local_324.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_324.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_334,1.0,1.0,0.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0x14);
  *(undefined8 *)pvVar7->m_data = local_334.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_334.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_344,1.0,0.5,0.5,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0x15);
  *(undefined8 *)pvVar7->m_data = local_344.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_344.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_354,0.0,0.0,0.5,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0x16);
  *(undefined8 *)pvVar7->m_data = local_354.m_data._0_8_;
  *(undefined8 *)(pvVar7->m_data + 2) = local_354.m_data._8_8_;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&h,1.0,1.0,1.0,1.0);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_colors,0x17);
  *(undefined8 *)pvVar7->m_data = _h;
  *(float (*) [2])(pvVar7->m_data + 2) = local_35c;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_positions,0x18);
  for (w = 0.0; (int)w < 0x18; w = (float)((int)w + 3)) {
    triNdx = (int)(64.0 / (float)local_74);
    quadNdx = (int)(64.0 / (float)local_70);
    quadY = (int)w / 3;
    quadX = quadY / 2;
    x0 = (float)(quadX / numQuads);
    y0 = (float)(quadX % numQuads);
    local_384 = (float)(int)y0 * (float)quadNdx + -1.0;
    local_388 = (float)(int)x0 * (float)triNdx + -1.0;
    if (quadY % 2 == 0) {
      tcu::Vector<float,_4>::Vector(&local_398,local_384,local_388,0.0,1.0);
      pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_positions,(long)(int)w);
      *(undefined8 *)pvVar7->m_data = local_398.m_data._0_8_;
      *(undefined8 *)(pvVar7->m_data + 2) = local_398.m_data._8_8_;
      tcu::Vector<float,_4>::Vector
                (&local_3a8,local_384 + (float)quadNdx,local_388 + (float)triNdx,0.0,1.0);
      pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_positions,(long)((int)w + 1));
      *(undefined8 *)pvVar7->m_data = local_3a8.m_data._0_8_;
      *(undefined8 *)(pvVar7->m_data + 2) = local_3a8.m_data._8_8_;
      tcu::Vector<float,_4>::Vector(&local_3b8,local_384,local_388 + (float)triNdx,0.0,1.0);
      pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_positions,(long)((int)w + 2));
      *(undefined8 *)pvVar7->m_data = local_3b8.m_data._0_8_;
      *(undefined8 *)(pvVar7->m_data + 2) = local_3b8.m_data._8_8_;
    }
    else {
      tcu::Vector<float,_4>::Vector
                (&local_3c8,local_384 + (float)quadNdx,local_388 + (float)triNdx,0.0,1.0);
      pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_positions,(long)(int)w);
      *(undefined8 *)pvVar7->m_data = local_3c8.m_data._0_8_;
      *(undefined8 *)(pvVar7->m_data + 2) = local_3c8.m_data._8_8_;
      tcu::Vector<float,_4>::Vector(&local_3d8,local_384,local_388,0.0,1.0);
      pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_positions,(long)((int)w + 1));
      *(undefined8 *)pvVar7->m_data = local_3d8.m_data._0_8_;
      *(undefined8 *)(pvVar7->m_data + 2) = local_3d8.m_data._8_8_;
      tcu::Vector<float,_4>::Vector(&local_3e8,local_384 + (float)quadNdx,local_388,0.0,1.0);
      pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_positions,(long)((int)w + 2));
      *(undefined8 *)pvVar7->m_data = local_3e8.m_data._0_8_;
      *(undefined8 *)(pvVar7->m_data + 2) = local_3e8.m_data._8_8_;
    }
  }
  this->m_viewportW = local_70;
  this->m_viewportH = local_74;
  this->m_iterNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void VertexIDCase::init (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				width		= m_context.getRenderTarget().getWidth();
	const int				height		= m_context.getRenderTarget().getHeight();

	const int				quadWidth	= 32;
	const int				quadHeight	= 32;

	if (width < quadWidth)
		throw tcu::NotSupportedError("Too small render target");

	const int				maxQuadsX	= width/quadWidth;
	const int				numVertices	= MAX_VERTICES;

	const int				numQuads	= numVertices/6 + (numVertices%6 != 0 ? 1 : 0);
	const int				viewportW	= de::min(numQuads, maxQuadsX)*quadWidth;
	const int				viewportH	= (numQuads/maxQuadsX + (numQuads%maxQuadsX != 0 ? 1 : 0))*quadHeight;

	if (viewportH > height)
		throw tcu::NotSupportedError("Too small render target");

	DE_ASSERT(viewportW <= width && viewportH <= height);

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"out mediump vec4 v_color;\n"
		"uniform highp vec4 u_colors[24];\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_color = u_colors[gl_VertexID];\n"
		"}\n",

		"#version 300 es\n"
		"in mediump vec4 v_color;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"void main (void)\n"
		"{\n"
		"	o_color = v_color;\n"
		"}\n"));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}

	gl.genBuffers(1, &m_positionBuffer);
	gl.genBuffers(1, &m_elementBuffer);

	// Set colors (in dynamic memory to save static data space).
	m_colors.resize(numVertices);
	m_colors[ 0] = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
	m_colors[ 1] = tcu::Vec4(0.5f, 1.0f, 0.5f, 1.0f);
	m_colors[ 2] = tcu::Vec4(0.0f, 0.5f, 1.0f, 1.0f);
	m_colors[ 3] = tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	m_colors[ 4] = tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f);
	m_colors[ 5] = tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f);
	m_colors[ 6] = tcu::Vec4(0.5f, 0.0f, 1.0f, 1.0f);
	m_colors[ 7] = tcu::Vec4(0.5f, 0.0f, 0.5f, 1.0f);
	m_colors[ 8] = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	m_colors[ 9] = tcu::Vec4(0.5f, 1.0f, 0.0f, 1.0f);
	m_colors[10] = tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f);
	m_colors[11] = tcu::Vec4(0.5f, 1.0f, 1.0f, 1.0f);
	m_colors[12] = tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	m_colors[13] = tcu::Vec4(1.0f, 0.0f, 0.5f, 1.0f);
	m_colors[14] = tcu::Vec4(0.0f, 0.5f, 0.5f, 1.0f);
	m_colors[15] = tcu::Vec4(1.0f, 1.0f, 0.5f, 1.0f);
	m_colors[16] = tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f);
	m_colors[17] = tcu::Vec4(1.0f, 0.5f, 0.0f, 1.0f);
	m_colors[18] = tcu::Vec4(0.0f, 1.0f, 0.5f, 1.0f);
	m_colors[19] = tcu::Vec4(1.0f, 0.5f, 1.0f, 1.0f);
	m_colors[20] = tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	m_colors[21] = tcu::Vec4(1.0f, 0.5f, 0.5f, 1.0f);
	m_colors[22] = tcu::Vec4(0.0f, 0.0f, 0.5f, 1.0f);
	m_colors[23] = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);

	// Compute positions.
	m_positions.resize(numVertices);
	DE_ASSERT(numVertices%3 == 0);
	for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx += 3)
	{
		const float	h			= 2.0f * float(quadHeight)/float(viewportH);
		const float	w			= 2.0f * float(quadWidth)/float(viewportW);

		const int	triNdx		= vtxNdx/3;
		const int	quadNdx		= triNdx/2;
		const int	quadY		= quadNdx/maxQuadsX;
		const int	quadX		= quadNdx%maxQuadsX;

		const float	x0			= -1.0f + float(quadX)*w;
		const float	y0			= -1.0f + float(quadY)*h;

		if (triNdx%2 == 0)
		{
			m_positions[vtxNdx+0] = tcu::Vec4(x0,   y0,   0.0f, 1.0f);
			m_positions[vtxNdx+1] = tcu::Vec4(x0+w, y0+h, 0.0f, 1.0f);
			m_positions[vtxNdx+2] = tcu::Vec4(x0,   y0+h, 0.0f, 1.0f);
		}
		else
		{
			m_positions[vtxNdx+0] = tcu::Vec4(x0+w, y0+h, 0.0f, 1.0f);
			m_positions[vtxNdx+1] = tcu::Vec4(x0,   y0,   0.0f, 1.0f);
			m_positions[vtxNdx+2] = tcu::Vec4(x0+w, y0,   0.0f, 1.0f);
		}
	}

	m_viewportW	= viewportW;
	m_viewportH	= viewportH;
	m_iterNdx	= 0;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}